

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O0

bool __thiscall
iDynTree::Rotation::getQuaternion(Rotation *this,double *s,double *r1,double *r2,double *r3)

{
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  double *in_R8;
  CoeffReturnType CVar1;
  CoeffReturnType CVar2;
  CoeffReturnType CVar3;
  DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
  *this_00;
  double dVar4;
  double quaternionNorm;
  double sign;
  double eps;
  double q3;
  double q2;
  double q1;
  double q0;
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> R;
  char *in_stack_fffffffffffffed8;
  Stride<0,_0> *in_stack_fffffffffffffee0;
  PointerArgType in_stack_fffffffffffffee8;
  Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>
  *in_stack_fffffffffffffef0;
  double local_78;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  
  Eigen::Stride<0,_0>::Stride(in_stack_fffffffffffffee0);
  Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  CVar1 = Eigen::
          DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                        *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c70e7);
  CVar2 = Eigen::
          DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                        *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c7102);
  CVar3 = Eigen::
          DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                        *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c712a);
  local_50 = CVar1 + CVar2 + CVar3 + 1.0;
  CVar1 = Eigen::
          DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                        *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c7160);
  CVar2 = Eigen::
          DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                        *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c717b);
  CVar3 = Eigen::
          DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                        *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c71a6);
  local_58 = ((CVar1 - CVar2) - CVar3) + 1.0;
  CVar1 = Eigen::
          DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                        *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c71df);
  CVar2 = Eigen::
          DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                        *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c7214);
  CVar3 = Eigen::
          DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                        *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c7242);
  local_60 = ((-CVar1 + CVar2) - CVar3) + 1.0;
  CVar1 = Eigen::
          DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                        *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c727b);
  CVar2 = Eigen::
          DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                        *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c72b0);
  CVar3 = Eigen::
          DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                        *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c72de);
  local_68 = (-CVar1 - CVar2) + CVar3 + 1.0;
  if (local_50 < 0.0) {
    local_50 = 0.0;
  }
  if (local_58 < 0.0) {
    local_58 = 0.0;
  }
  if (local_60 < 0.0) {
    local_60 = 0.0;
  }
  if (local_68 < 0.0) {
    local_68 = 0.0;
  }
  if (((local_50 < local_58) || (local_50 < local_60)) || (local_50 < local_68)) {
    if (((local_58 < local_50) || (local_58 < local_60)) || (local_58 < local_68)) {
      if (((local_60 < local_50) || (local_60 < local_58)) || (local_60 < local_68)) {
        if (((local_68 < local_50) || (local_68 < local_58)) || (local_68 < local_60)) {
          reportError((char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(char *)0x6c79ec);
          return false;
        }
        local_68 = sqrt(local_68);
        CVar1 = Eigen::
                DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                              *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c78b1)
        ;
        CVar2 = Eigen::
                DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                              *)in_stack_fffffffffffffee0,(Index)CVar1,0x6c78cc);
        local_50 = (CVar1 - CVar2) / (local_68 * 2.0);
        this_00 = (DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                   *)Eigen::
                     DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                     ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                                   *)in_stack_fffffffffffffee0,(Index)CVar1,0x6c790c);
        CVar2 = Eigen::
                DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                ::operator()(this_00,(Index)CVar1,0x6c7928);
        local_58 = ((double)this_00 + CVar2) / (local_68 * 2.0);
        CVar2 = Eigen::
                DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                ::operator()(this_00,(Index)CVar1,0x6c796a);
        CVar1 = Eigen::
                DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                ::operator()(this_00,(Index)CVar1,0x6c7987);
        local_60 = (CVar2 + CVar1) / (local_68 * 2.0);
        local_68 = local_68 / 2.0;
      }
      else {
        local_60 = sqrt(local_60);
        CVar1 = Eigen::
                DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                              *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c7716)
        ;
        CVar2 = Eigen::
                DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                              *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c7732)
        ;
        local_50 = (CVar1 - CVar2) / (local_60 * 2.0);
        CVar1 = Eigen::
                DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                              *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c7773)
        ;
        CVar2 = Eigen::
                DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                              *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c778f)
        ;
        local_58 = (CVar1 + CVar2) / (local_60 * 2.0);
        CVar1 = Eigen::
                DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                              *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c77d1)
        ;
        CVar2 = Eigen::
                DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                              *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c77ee)
        ;
        local_68 = (CVar1 + CVar2) / (local_60 * 2.0);
        local_60 = local_60 / 2.0;
      }
    }
    else {
      local_58 = sqrt(local_58);
      CVar1 = Eigen::
              DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                            *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c757c);
      CVar2 = Eigen::
              DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                            *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c7599);
      local_50 = (CVar1 - CVar2) / (local_58 * 2.0);
      CVar1 = Eigen::
              DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                            *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c75da);
      CVar2 = Eigen::
              DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                            *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c75f6);
      local_60 = (CVar1 + CVar2) / (local_58 * 2.0);
      CVar1 = Eigen::
              DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                            *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c7637);
      CVar2 = Eigen::
              DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                            *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c7653);
      local_68 = (CVar1 + CVar2) / (local_58 * 2.0);
      local_58 = local_58 / 2.0;
    }
  }
  else {
    local_50 = sqrt(local_50);
    CVar1 = Eigen::
            DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
            ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                          *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c73e1);
    CVar2 = Eigen::
            DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
            ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                          *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c73fe);
    local_58 = (CVar1 - CVar2) / (local_50 * 2.0);
    CVar1 = Eigen::
            DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
            ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                          *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c743f);
    CVar2 = Eigen::
            DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
            ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                          *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c745b);
    local_60 = (CVar1 - CVar2) / (local_50 * 2.0);
    CVar1 = Eigen::
            DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
            ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                          *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c749c);
    CVar2 = Eigen::
            DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
            ::operator()((DenseCoeffsBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>
                          *)in_stack_fffffffffffffee0,(Index)in_stack_fffffffffffffed8,0x6c74b8);
    local_68 = (CVar1 - CVar2) / (local_50 * 2.0);
    local_50 = local_50 / 2.0;
  }
  local_78 = 1.0;
  if ((1e-07 < local_50) || (local_50 < -1e-07)) {
    local_78 = (double)(~-(ulong)(0.0 < local_50) & 0xbff0000000000000 |
                       (ulong)((uint)(-(ulong)(0.0 < local_50) >> 0x20) & 0x3ff00000) << 0x20);
  }
  else if ((1e-07 < local_58) || (local_58 < -1e-07)) {
    local_78 = (double)(~-(ulong)(0.0 < local_58) & 0xbff0000000000000 |
                       (ulong)((uint)(-(ulong)(0.0 < local_58) >> 0x20) & 0x3ff00000) << 0x20);
  }
  else if ((1e-07 < local_60) || (local_60 < -1e-07)) {
    local_78 = (double)(~-(ulong)(0.0 < local_60) & 0xbff0000000000000 |
                       (ulong)((uint)(-(ulong)(0.0 < local_60) >> 0x20) & 0x3ff00000) << 0x20);
  }
  else if ((1e-07 < local_68) || (local_68 < -1e-07)) {
    local_78 = (double)(~-(ulong)(0.0 < local_68) & 0xbff0000000000000 |
                       (ulong)((uint)(-(ulong)(0.0 < local_68) >> 0x20) & 0x3ff00000) << 0x20);
  }
  local_50 = local_50 / local_78;
  local_58 = local_58 / local_78;
  local_60 = local_60 / local_78;
  local_68 = local_68 / local_78;
  dVar4 = sqrt(local_68 * local_68 + local_60 * local_60 + local_50 * local_50 + local_58 * local_58
              );
  *in_RSI = local_50 / dVar4;
  *in_RDX = local_58 / dVar4;
  *in_RCX = local_60 / dVar4;
  *in_R8 = local_68 / dVar4;
  return true;
}

Assistant:

bool Rotation::getQuaternion(double &s, double &r1, double &r2, double &r3) const
    {
        Eigen::Map<const Matrix3dRowMajor> R(m_data);

        //Taken from "Contributions au contrôle automatique de véhicules aériens"
        //PhD thesis of "Minh Duc HUA"
        //INRIA Sophia Antipolis
        //www.isir.upmc.fr/files/2009THDR2323.pdf
        //Equation 3.9 (page 101)

        //Diagonal elements used only to find the maximum
        //the furthest value from zero
        //we use this value as denominator to find the other elements
        double q0 = ( R(0,0) + R(1,1) + R(2,2) + 1.0);
        double q1 = ( R(0,0) - R(1,1) - R(2,2) + 1.0);
        double q2 = (-R(0,0) + R(1,1) - R(2,2) + 1.0);
        double q3 = (-R(0,0) - R(1,1) + R(2,2) + 1.0);

        if (q0 < 0.0) q0 = 0.0;
        if (q1 < 0.0) q1 = 0.0;
        if (q2 < 0.0) q2 = 0.0;
        if (q3 < 0.0) q3 = 0.0;

        if (q0 >= q1 && q0 >= q2 && q0 >= q3) {
            q0 = std::sqrt(q0);
            q1 = (R(2,1) - R(1,2)) / (2.0 * q0);
            q2 = (R(0,2) - R(2,0)) / (2.0 * q0);
            q3 = (R(1,0) - R(0,1)) / (2.0 * q0);
            q0 /= 2.0;
        } else if (q1 >= q0 && q1 >= q2 && q1 >= q3) {
            q1 = std::sqrt(q1);
            q0 = (R(2,1) - R(1,2)) / (2.0 * q1);
            q2 = (R(1,0) + R(0,1)) / (2.0 * q1);
            q3 = (R(2,0) + R(0,2)) / (2.0 * q1);
            q1 /= 2.0;
        } else if (q2 >= q0 && q2 >= q1 && q2 >= q3) {
            q2 = std::sqrt(q2);
            q0 = (R(0,2) - R(2,0)) / (2.0 * q2);
            q1 = (R(1,0) + R(0,1)) / (2.0 * q2);
            q3 = (R(1,2) + R(2,1)) / (2.0 * q2);
            q2 /= 2.0;
        } else if (q3 >= q0 && q3 >= q1 && q3 >= q2) {
            q3 = std::sqrt(q3);
            q0 = (R(1,0) - R(0,1)) / (2.0 * q3);
            q1 = (R(2,0) + R(0,2)) / (2.0 * q3);
            q2 = (R(1,2) + R(2,1)) / (2.0 * q3);
            q3 /= 2.0;
        } else {
            reportError("Rotation", "getQuaternion", "Quaternion numerically bad conditioned");
            return false;
        }

        //Here we impose that the leftmost nonzero element of the quaternion is positive
        double eps = 1e-7;
        double sign = 1.0;
        if (q0 > eps || q0 < -eps) {
            sign = q0 > 0 ? 1.0 : -1.0;
        } else if (q1 > eps || q1 < -eps) {
            sign = q1 > 0 ? 1.0 : -1.0;
        } else if (q2 > eps || q2 < -eps) {
            sign = q2 > 0 ? 1.0 : -1.0;
        } else if (q3 > eps || q3 < -eps) {
            sign = q3 > 0 ? 1.0 : -1.0;
        }

        q0 /= sign;
        q1 /= sign;
        q2 /= sign;
        q3 /= sign;

        double quaternionNorm = std::sqrt(q0 * q0 +
                                          q1 * q1 +
                                          q2 * q2 +
                                          q3 * q3);
        s  = q0 / quaternionNorm;
        r1 = q1 / quaternionNorm;
        r2 = q2 / quaternionNorm;
        r3 = q3 / quaternionNorm;
        return true;
    }